

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_ext_buf(mpack_reader_t *reader,int8_t *type,char *buf,size_t bufsize)

{
  uint32_t uVar1;
  mpack_error_t mVar2;
  size_t extsize;
  size_t bufsize_local;
  char *buf_local;
  int8_t *type_local;
  mpack_reader_t *reader_local;
  
  uVar1 = mpack_expect_ext(reader,type);
  reader_local = (mpack_reader_t *)(ulong)uVar1;
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    if (bufsize < reader_local) {
      mpack_reader_flag_error(reader,mpack_error_too_big);
      reader_local = (mpack_reader_t *)0x0;
    }
    else {
      mpack_read_bytes(reader,buf,(size_t)reader_local);
      mVar2 = mpack_reader_error(reader);
      if (mVar2 == mpack_ok) {
        mpack_done_ext(reader);
      }
      else {
        reader_local = (mpack_reader_t *)0x0;
      }
    }
  }
  else {
    reader_local = (mpack_reader_t *)0x0;
  }
  return (size_t)reader_local;
}

Assistant:

size_t mpack_expect_ext_buf(mpack_reader_t* reader, int8_t* type, char* buf, size_t bufsize) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t extsize = mpack_expect_ext(reader, type);
    if (mpack_reader_error(reader))
        return 0;
    if (extsize > bufsize) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return 0;
    }
    mpack_read_bytes(reader, buf, extsize);
    if (mpack_reader_error(reader))
        return 0;
    mpack_done_ext(reader);
    return extsize;
}